

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cpp
# Opt level: O1

void __thiscall
Integer_LeadingZerosAreNotAllowed_Test::TestBody(Integer_LeadingZerosAreNotAllowed_Test *this)

{
  bool *pbVar1;
  bool bVar2;
  events_aggregator_t handler;
  istringstream input;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  AssertHelper local_1e0;
  events_aggregator_t local_1d8;
  parser_t<events_aggregator_t> local_1b8;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  pbVar1 = &local_1b8.input.m_emit_eol;
  local_1b8.input.m_backend = (istream *)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"key = 01","");
  std::__cxx11::istringstream::istringstream(local_198,(string *)&local_1b8,_S_in);
  if (local_1b8.input.m_backend != (istream *)pbVar1) {
    operator_delete(local_1b8.input.m_backend);
  }
  local_1d8.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1b8.input.m_processed = 0;
    local_1b8.input.m_emit_eol = true;
    local_1b8.handler = &local_1d8;
    local_1b8.input.m_backend = (istream *)local_198;
    loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse(&local_1b8);
  }
  testing::Message::Message((Message *)&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/integer.cpp"
             ,0xe5,
             "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_1e8);
  testing::internal::AssertHelper::~AssertHelper(&local_1e0);
  if (local_1e8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_1e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1e8.ptr_ + 8))();
    }
    local_1e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&local_1d8.events);
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

TEST(Integer, PositiveOutOfRange3) {
    std::istringstream input("key = 19223372036854775808");
    events_aggregator_t handler;

    EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
}